

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::SetCompilerFlags
          (cmGhsMultiTargetGenerator *this,string *config,string *language)

{
  char *__s;
  cmGeneratorTarget *pcVar1;
  cmLocalGenerator *pcVar2;
  cmLocalGhsMultiGenerator *pcVar3;
  bool bVar4;
  iterator iVar5;
  value_type entry;
  string flags;
  allocator<char> local_99;
  string *local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_50;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->FlagsByLanguage)._M_t,language);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    __s = (language->_M_dataplus)._M_p;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    local_98 = config;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_99);
    cmLocalGenerator::AddLanguageFlags(pcVar2,&local_50,pcVar1,&local_90.first,local_98);
    std::__cxx11::string::~string((string *)&local_90);
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_99);
    cmLocalGenerator::AddCMP0018Flags(pcVar2,&local_50,pcVar1,&local_90.first,local_98);
    std::__cxx11::string::~string((string *)&local_90);
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_99);
    cmLocalGenerator::AddVisibilityPresetFlags(pcVar2,&local_50,pcVar1,&local_90.first);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,(string *)&this->Makefile->DefineFlags);
    bVar4 = std::operator!=(&local_90.first," ");
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar4) {
      pcVar3 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_90,(string *)&this->Makefile->DefineFlags);
      (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar3,&local_50,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    pcVar1 = this->GeneratorTarget;
    pcVar2 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_99);
    cmLocalGenerator::AddCompileOptions(pcVar2,&local_50,pcVar1,&local_90.first,local_98);
    std::__cxx11::string::~string((string *)&local_90);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_90,language,&local_50);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->FlagsByLanguage,&local_90);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::SetCompilerFlags(std::string const& config,
                                                 const std::string& language)
{
  std::map<std::string, std::string>::iterator i =
    this->FlagsByLanguage.find(language);
  if (i == this->FlagsByLanguage.end()) {
    std::string flags;
    const char* lang = language.c_str();

    this->LocalGenerator->AddLanguageFlags(flags, this->GeneratorTarget, lang,
                                           config);

    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget, lang,
                                          config);
    this->LocalGenerator->AddVisibilityPresetFlags(
      flags, this->GeneratorTarget, lang);

    // Append old-style preprocessor definition flags.
    if (this->Makefile->GetDefineFlags() != " ") {
      this->LocalGenerator->AppendFlags(flags,
                                        this->Makefile->GetDefineFlags());
    }

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget, lang,
                                            config);

    std::map<std::string, std::string>::value_type entry(language, flags);
    i = this->FlagsByLanguage.insert(entry).first;
  }
}